

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_vector_generated.h
# Opt level: O1

Offset<Movie> CreateMovie(FlatBufferBuilder *_fbb,MovieT *_o,rehasher_function_t *_rehasher)

{
  Character e;
  uoffset_t start;
  Offset<void> off;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> off_00;
  Offset<flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>_> off_01;
  Offset<Movie> OVar1;
  long lVar2;
  _VectorArgs _va;
  FlatBufferBuilder *local_48;
  MovieT *local_40;
  rehasher_function_t *local_38;
  
  e = (_o->main_character).type;
  off_01.o = 0;
  local_48 = _fbb;
  local_40 = _o;
  local_38 = _rehasher;
  off = CharacterUnion::Pack(&_o->main_character,_fbb,(rehasher_function_t *)0x0);
  off_00.o = 0;
  lVar2 = (long)(_o->characters).super__Vector_base<CharacterUnion,_std::allocator<CharacterUnion>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(_o->characters).super__Vector_base<CharacterUnion,_std::allocator<CharacterUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    off_00 = flatbuffers::FlatBufferBuilderImpl<false>::
             CreateVector<unsigned_char,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_1_,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                       (_fbb,lVar2 >> 4,&local_48);
  }
  lVar2 = (long)(_o->characters).super__Vector_base<CharacterUnion,_std::allocator<CharacterUnion>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(_o->characters).super__Vector_base<CharacterUnion,_std::allocator<CharacterUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    off_01 = flatbuffers::FlatBufferBuilderImpl<false>::
             CreateVector<flatbuffers::Offset<void>,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_2_,CreateMovie(flatbuffers::FlatBufferBuilderImpl<false>&,MovieT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                       (_fbb,lVar2 >> 4,&local_48);
  }
  flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
  _fbb->nested = true;
  start = (_fbb->buf_).size_;
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<void>,unsigned_int>>(_fbb,10,off_01);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>(_fbb,8,off_00);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<void>(_fbb,6,off);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,4,e,'\0');
  OVar1.o = flatbuffers::FlatBufferBuilderImpl<false>::EndTable(_fbb,start);
  return (Offset<Movie>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Movie> CreateMovie(::flatbuffers::FlatBufferBuilder &_fbb, const MovieT *_o, const ::flatbuffers::rehasher_function_t *_rehasher) {
  (void)_rehasher;
  (void)_o;
  struct _VectorArgs { ::flatbuffers::FlatBufferBuilder *__fbb; const MovieT* __o; const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { &_fbb, _o, _rehasher}; (void)_va;
  auto _main_character_type = _o->main_character.type;
  auto _main_character = _o->main_character.Pack(_fbb);
  auto _characters_type = _o->characters.size() ? _fbb.CreateVector<uint8_t>(_o->characters.size(), [](size_t i, _VectorArgs *__va) { return static_cast<uint8_t>(__va->__o->characters[i].type); }, &_va) : 0;
  auto _characters = _o->characters.size() ? _fbb.CreateVector<::flatbuffers::Offset<void>>(_o->characters.size(), [](size_t i, _VectorArgs *__va) { return __va->__o->characters[i].Pack(*__va->__fbb, __va->__rehasher); }, &_va) : 0;
  return CreateMovie(
      _fbb,
      _main_character_type,
      _main_character,
      _characters_type,
      _characters);
}